

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_create_list2(lysc_node *schema,char *keys,size_t keys_len,ly_bool store_only,
                       lyd_node **node)

{
  ly_path_predicate *local_50;
  ly_path_predicate *predicates;
  lyxp_expr *plStack_40;
  uint32_t exp_idx;
  lyxp_expr *expr;
  lyd_node **pplStack_30;
  LY_ERR ret;
  lyd_node **node_local;
  size_t sStack_20;
  ly_bool store_only_local;
  size_t keys_len_local;
  char *keys_local;
  lysc_node *schema_local;
  
  expr._4_4_ = 0;
  plStack_40 = (lyxp_expr *)0x0;
  predicates._4_4_ = 0;
  local_50 = (ly_path_predicate *)0x0;
  pplStack_30 = node;
  node_local._7_1_ = store_only;
  sStack_20 = keys_len;
  keys_len_local = (size_t)keys;
  keys_local = (char *)schema;
  ly_log_location(schema,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  expr._4_4_ = ly_path_parse_predicate
                         ((ly_ctx *)**(undefined8 **)(keys_local + 8),(lysc_node *)0x0,
                          (char *)keys_len_local,sStack_20,0x10,0x100,&stack0xffffffffffffffc0);
  if ((expr._4_4_ == LY_SUCCESS) &&
     (expr._4_4_ = ly_path_compile_predicate
                             ((ly_ctx *)**(undefined8 **)(keys_local + 8),(lysc_node *)0x0,
                              (lys_module *)0x0,(lysc_node *)keys_local,plStack_40,
                              (uint32_t *)((long)&predicates + 4),LY_VALUE_JSON,(void *)0x0,
                              &local_50), expr._4_4_ == LY_SUCCESS)) {
    expr._4_4_ = lyd_create_list((lysc_node *)keys_local,local_50,(lyxp_var *)0x0,node_local._7_1_,
                                 pplStack_30);
  }
  ly_log_location_revert(1,0,0,0);
  lyxp_expr_free((ly_ctx *)**(undefined8 **)(keys_local + 8),plStack_40);
  ly_path_predicates_free((ly_ctx *)**(undefined8 **)(keys_local + 8),local_50);
  return expr._4_4_;
}

Assistant:

LY_ERR
lyd_create_list2(const struct lysc_node *schema, const char *keys, size_t keys_len, ly_bool store_only, struct lyd_node **node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *expr = NULL;
    uint32_t exp_idx = 0;
    struct ly_path_predicate *predicates = NULL;

    LOG_LOCSET(schema, NULL);

    /* parse keys */
    LY_CHECK_GOTO(ret = ly_path_parse_predicate(schema->module->ctx, NULL, keys, keys_len, LY_PATH_PREFIX_OPTIONAL,
            LY_PATH_PRED_KEYS, &expr), cleanup);

    /* compile them */
    LY_CHECK_GOTO(ret = ly_path_compile_predicate(schema->module->ctx, NULL, NULL, schema, expr, &exp_idx, LY_VALUE_JSON,
            NULL, &predicates), cleanup);

    /* create the list node */
    LY_CHECK_GOTO(ret = lyd_create_list(schema, predicates, NULL, store_only, node), cleanup);

cleanup:
    LOG_LOCBACK(1, 0);
    lyxp_expr_free(schema->module->ctx, expr);
    ly_path_predicates_free(schema->module->ctx, predicates);
    return ret;
}